

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3_api_wrapper.cpp
# Opt level: O0

int duckdb_shell_sqlite3_bind_text
              (sqlite3_stmt *stmt,int idx,char *val,int length,_func_void_void_ptr *free_func)

{
  sqlite3_stmt *psVar1;
  int in_ECX;
  sqlite3_stmt *in_RDX;
  int in_ESI;
  Value *in_RDI;
  code *in_R8;
  exception *ex;
  string value;
  undefined4 in_stack_fffffffffffffea0;
  sqlite3_stmt *in_stack_fffffffffffffeb8;
  string asStack_110 [40];
  string *in_stack_ffffffffffffff18;
  Value *in_stack_ffffffffffffff20;
  allocator aStack_a9;
  string asStack_a8 [55];
  allocator aStack_71;
  string asStack_70 [32];
  string asStack_50 [32];
  code *pcStack_30;
  int iStack_24;
  sqlite3_stmt *psStack_20;
  int iStack_14;
  Value *pVStack_10;
  int iStack_4;
  
  if (in_RDX == (sqlite3_stmt *)0x0) {
    iStack_4 = 0x15;
  }
  else {
    pcStack_30 = in_R8;
    iStack_24 = in_ECX;
    psStack_20 = in_RDX;
    iStack_14 = in_ESI;
    pVStack_10 = in_RDI;
    std::__cxx11::string::string(asStack_50);
    psVar1 = psStack_20;
    if (iStack_24 < 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(asStack_70,(char *)psVar1,&aStack_71);
      std::__cxx11::string::operator=(asStack_50,asStack_70);
      std::__cxx11::string::~string(asStack_70);
      std::allocator<char>::~allocator((allocator<char> *)&aStack_71);
    }
    else {
      in_stack_fffffffffffffeb8 = psStack_20;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (asStack_a8,(char *)in_stack_fffffffffffffeb8,(long)iStack_24,&aStack_a9);
      std::__cxx11::string::operator=(asStack_50,asStack_a8);
      std::__cxx11::string::~string(asStack_a8);
      std::allocator<char>::~allocator((allocator<char> *)&aStack_a9);
    }
    if ((pcStack_30 != (code *)0x0) && (pcStack_30 != (code *)0xffffffffffffffff)) {
      (*pcStack_30)(psStack_20);
      psStack_20 = (sqlite3_stmt *)0x0;
    }
    std::__cxx11::string::string(asStack_110,asStack_50);
    duckdb::Value::Value(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    iStack_4 = sqlite3_internal_bind_value(in_stack_fffffffffffffeb8,iStack_14,pVStack_10);
    duckdb::Value::~Value((Value *)CONCAT44(iStack_4,in_stack_fffffffffffffea0));
    std::__cxx11::string::~string(asStack_110);
    std::__cxx11::string::~string(asStack_50);
  }
  return iStack_4;
}

Assistant:

int sqlite3_bind_text(sqlite3_stmt *stmt, int idx, const char *val, int length, void (*free_func)(void *)) {
	if (!val) {
		return SQLITE_MISUSE;
	}
	string value;
	if (length < 0) {
		value = string(val);
	} else {
		value = string(val, length);
	}
	if (free_func && ((ptrdiff_t)free_func) != -1) {
		free_func((void *)val);
		val = nullptr;
	}
	try {
		return sqlite3_internal_bind_value(stmt, idx, Value(value));
	} catch (std::exception &ex) {
		return SQLITE_ERROR;
	}
}